

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer.cc
# Opt level: O0

void __thiscall
wabt::anon_unknown_1::BinaryWriter::WriteNames<wabt::Func>
          (BinaryWriter *this,vector<wabt::Func_*,_std::allocator<wabt::Func_*>_> *elems,
          NameSectionSubsection type)

{
  value_type this_00;
  Stream *stream;
  string_view name;
  bool bVar1;
  Func *pFVar2;
  const_reference ppFVar3;
  ulong uVar4;
  Func *elem_1;
  size_t i;
  char desc [100];
  Func *elem;
  const_iterator __end0;
  const_iterator __begin0;
  vector<wabt::Func_*,_std::allocator<wabt::Func_*>_> *__range2;
  size_t num_named_elems;
  NameSectionSubsection type_local;
  vector<wabt::Func_*,_std::allocator<wabt::Func_*>_> *elems_local;
  BinaryWriter *this_local;
  
  __range2 = (vector<wabt::Func_*,_std::allocator<wabt::Func_*>_> *)0x0;
  __end0 = std::vector<wabt::Func_*,_std::allocator<wabt::Func_*>_>::begin(elems);
  elem = (Func *)std::vector<wabt::Func_*,_std::allocator<wabt::Func_*>_>::end(elems);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end0,(__normal_iterator<wabt::Func_*const_*,_std::vector<wabt::Func_*,_std::allocator<wabt::Func_*>_>_>
                                     *)&elem), bVar1) {
    __gnu_cxx::
    __normal_iterator<wabt::Func_*const_*,_std::vector<wabt::Func_*,_std::allocator<wabt::Func_*>_>_>
    ::operator*(&__end0);
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      __range2 = (vector<wabt::Func_*,_std::allocator<wabt::Func_*>_> *)
                 ((long)&(__range2->super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>)
                         ._M_impl.super__Vector_impl_data._M_start + 1);
    }
    __gnu_cxx::
    __normal_iterator<wabt::Func_*const_*,_std::vector<wabt::Func_*,_std::allocator<wabt::Func_*>_>_>
    ::operator++(&__end0);
  }
  if (__range2 != (vector<wabt::Func_*,_std::allocator<wabt::Func_*>_> *)0x0) {
    WriteU32Leb128<wabt::NameSectionSubsection>(this->stream_,type,"name subsection type");
    BeginSubsection(this,"name subsection");
    WriteU32Leb128<unsigned_long>(this->stream_,(unsigned_long)__range2,"num names");
    for (elem_1 = (Func *)0x0;
        pFVar2 = (Func *)std::vector<wabt::Func_*,_std::allocator<wabt::Func_*>_>::size(elems),
        elem_1 < pFVar2; elem_1 = (Func *)&(elem_1->name).field_0x1) {
      ppFVar3 = std::vector<wabt::Func_*,_std::allocator<wabt::Func_*>_>::operator[]
                          (elems,(size_type)elem_1);
      this_00 = *ppFVar3;
      uVar4 = std::__cxx11::string::empty();
      if ((uVar4 & 1) == 0) {
        WriteU32Leb128<unsigned_long>(this->stream_,(unsigned_long)elem_1,"elem index");
        snprintf((char *)&i,100,"elem name %zd",elem_1);
        stream = this->stream_;
        name = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)this_00);
        WriteDebugName(stream,name,(char *)&i);
      }
    }
    EndSubsection(this);
  }
  return;
}

Assistant:

void BinaryWriter::WriteNames(const std::vector<T*>& elems,
                              NameSectionSubsection type) {
  size_t num_named_elems = 0;
  for (const T* elem : elems) {
    if (!elem->name.empty()) {
      num_named_elems++;
    }
  }

  if (!num_named_elems) {
    return;
  }

  WriteU32Leb128(stream_, type, "name subsection type");
  BeginSubsection("name subsection");

  char desc[100];
  WriteU32Leb128(stream_, num_named_elems, "num names");
  for (size_t i = 0; i < elems.size(); ++i) {
    const T* elem = elems[i];
    if (elem->name.empty()) {
      continue;
    }
    WriteU32Leb128(stream_, i, "elem index");
    wabt_snprintf(desc, sizeof(desc), "elem name %" PRIzd, i);
    WriteDebugName(stream_, elem->name, desc);
  }
  EndSubsection();
}